

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O2

void mg_ev_mgr_init(mg_mgr *mgr)

{
  if (LL_DEBUG < s_cs_log_level) {
    fprintf(_stderr,"%-20s ","mg_ev_mgr_init");
    cs_log_printf("%p using select()",mgr);
  }
  do {
    mg_socketpair(mgr->ctl,2);
  } while (mgr->ctl[0] == -1);
  return;
}

Assistant:

void mg_ev_mgr_init(struct mg_mgr *mgr) {
    (void) mgr;
    DBG(("%p using select()", mgr));
#ifndef MG_DISABLE_SOCKETPAIR
    do {
        mg_socketpair(mgr->ctl, SOCK_DGRAM);
    } while (mgr->ctl[0] == INVALID_SOCKET);
#endif
}